

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

SockData * AGSSock::recv_extract<AGSSock::SockData>(Buffer *buffer,bool stream)

{
  string *this;
  SockData *data;
  bool stream_local;
  Buffer *buffer_local;
  
  this = (string *)operator_new(0x20);
  SockData::SockData((SockData *)this);
  (**(code **)(*AGSSockAPI::engine + 0x220))(AGSSockAPI::engine,this,&agsSockData);
  Buffer::front_abi_cxx11_(buffer);
  std::__cxx11::string::swap(this);
  Buffer::pop(buffer);
  return (SockData *)this;
}

Assistant:

inline SockData *recv_extract(Buffer &buffer, bool stream)
{
	// For SockData output, we don't have to worry about zero-characters,
	// thus we receive everything and then clear the buffer.
	SockData *data = new SockData();
	AGS_OBJECT(SockData, data);
	data->data.swap(buffer.front());
	buffer.pop();
	return data;
}